

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::XmlReporter::benchmarkEnded
          (XmlReporter *this,
          BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
          *benchmarkStats)

{
  XmlFormatting XVar1;
  XmlWriter *pXVar2;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  rep_conflict local_1c0;
  allocator<char> local_1b1;
  string local_1b0;
  rep_conflict local_190;
  allocator<char> local_181;
  string local_180;
  rep_conflict local_160;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  rep_conflict local_e0;
  allocator<char> local_d1;
  string local_d0;
  rep_conflict local_b0;
  allocator<char> local_a1;
  string local_a0;
  rep_conflict local_80;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *local_18;
  BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *benchmarkStats_local
  ;
  XmlReporter *this_local;
  
  local_18 = benchmarkStats;
  benchmarkStats_local =
       (BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"mean",&local_39);
  XVar1 = operator|(Newline,Indent);
  pXVar2 = XmlWriter::startElement(&this->m_xml,&local_38,XVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"value",&local_71);
  local_80 = std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                       (&(local_18->mean).point);
  pXVar2 = XmlWriter::writeAttribute<double>(pXVar2,&local_70,&local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"lowerBound",&local_a1);
  local_b0 = std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                       (&(local_18->mean).lower_bound);
  pXVar2 = XmlWriter::writeAttribute<double>(pXVar2,&local_a0,&local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"upperBound",&local_d1);
  local_e0 = std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                       (&(local_18->mean).upper_bound);
  pXVar2 = XmlWriter::writeAttribute<double>(pXVar2,&local_d0,&local_e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"ci",&local_101);
  XmlWriter::writeAttribute<double>(pXVar2,&local_100,&(local_18->mean).confidence_interval);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  XVar1 = operator|(Newline,Indent);
  XmlWriter::endElement(&this->m_xml,XVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"standardDeviation",&local_129);
  XVar1 = operator|(Newline,Indent);
  pXVar2 = XmlWriter::startElement(&this->m_xml,&local_128,XVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"value",&local_151);
  local_160 = std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                        (&(local_18->standardDeviation).point);
  pXVar2 = XmlWriter::writeAttribute<double>(pXVar2,&local_150,&local_160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"lowerBound",&local_181);
  local_190 = std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                        (&(local_18->standardDeviation).lower_bound);
  pXVar2 = XmlWriter::writeAttribute<double>(pXVar2,&local_180,&local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"upperBound",&local_1b1);
  local_1c0 = std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                        (&(local_18->standardDeviation).upper_bound);
  pXVar2 = XmlWriter::writeAttribute<double>(pXVar2,&local_1b0,&local_1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"ci",&local_1e1);
  XmlWriter::writeAttribute<double>
            (pXVar2,&local_1e0,&(local_18->standardDeviation).confidence_interval);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  XVar1 = operator|(Newline,Indent);
  XmlWriter::endElement(&this->m_xml,XVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"outliers",&local_209);
  XVar1 = operator|(Newline,Indent);
  pXVar2 = XmlWriter::startElement(&this->m_xml,&local_208,XVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"variance",&local_231);
  pXVar2 = XmlWriter::writeAttribute<double>(pXVar2,&local_230,&local_18->outlierVariance);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"lowMild",&local_259);
  pXVar2 = XmlWriter::writeAttribute<int>(pXVar2,&local_258,&(local_18->outliers).low_mild);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"lowSevere",&local_281);
  pXVar2 = XmlWriter::writeAttribute<int>(pXVar2,&local_280,&(local_18->outliers).low_severe);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"highMild",&local_2a9);
  pXVar2 = XmlWriter::writeAttribute<int>(pXVar2,&local_2a8,&(local_18->outliers).high_mild);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"highSevere",&local_2d1);
  XmlWriter::writeAttribute<int>(pXVar2,&local_2d0,&(local_18->outliers).high_severe);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  XVar1 = operator|(Newline,Indent);
  XmlWriter::endElement(&this->m_xml,XVar1);
  XVar1 = operator|(Newline,Indent);
  XmlWriter::endElement(&this->m_xml,XVar1);
  return;
}

Assistant:

void XmlReporter::benchmarkEnded(BenchmarkStats<> const &benchmarkStats) {
        m_xml.startElement("mean")
            .writeAttribute("value", benchmarkStats.mean.point.count())
            .writeAttribute("lowerBound", benchmarkStats.mean.lower_bound.count())
            .writeAttribute("upperBound", benchmarkStats.mean.upper_bound.count())
            .writeAttribute("ci", benchmarkStats.mean.confidence_interval);
        m_xml.endElement();
        m_xml.startElement("standardDeviation")
            .writeAttribute("value", benchmarkStats.standardDeviation.point.count())
            .writeAttribute("lowerBound", benchmarkStats.standardDeviation.lower_bound.count())
            .writeAttribute("upperBound", benchmarkStats.standardDeviation.upper_bound.count())
            .writeAttribute("ci", benchmarkStats.standardDeviation.confidence_interval);
        m_xml.endElement();
        m_xml.startElement("outliers")
            .writeAttribute("variance", benchmarkStats.outlierVariance)
            .writeAttribute("lowMild", benchmarkStats.outliers.low_mild)
            .writeAttribute("lowSevere", benchmarkStats.outliers.low_severe)
            .writeAttribute("highMild", benchmarkStats.outliers.high_mild)
            .writeAttribute("highSevere", benchmarkStats.outliers.high_severe);
        m_xml.endElement();
        m_xml.endElement();
    }